

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

JsonObjectWriter * __thiscall Catch::JsonReporter::startObject(JsonReporter *this,StringRef key)

{
  reference pvVar1;
  size_t in_RDX;
  void *in_RSI;
  JsonObjectWriter *in_RDI;
  JsonValueWriter *in_stack_fffffffffffffdf8;
  JsonObjectWriter local_1c8 [18];
  void *local_10;
  size_t sStack_8;
  
  local_10 = in_RSI;
  sStack_8 = in_RDX;
  pvVar1 = std::
           stack<Catch::JsonObjectWriter,_std::deque<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>_>
           ::top((stack<Catch::JsonObjectWriter,_std::deque<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>_>
                  *)0x1a37ad);
  JsonObjectWriter::write(local_1c8,(int)pvVar1,local_10,sStack_8);
  JsonValueWriter::writeObject(in_stack_fffffffffffffdf8);
  std::
  stack<Catch::JsonObjectWriter,_std::deque<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>_>
  ::emplace<Catch::JsonObjectWriter>
            ((stack<Catch::JsonObjectWriter,_std::deque<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>_>
              *)in_RDI,(JsonObjectWriter *)in_stack_fffffffffffffdf8);
  JsonObjectWriter::~JsonObjectWriter(in_RDI);
  JsonValueWriter::~JsonValueWriter((JsonValueWriter *)0x1a3815);
  std::
  stack<Catch::JsonReporter::Writer,_std::deque<Catch::JsonReporter::Writer,_std::allocator<Catch::JsonReporter::Writer>_>_>
  ::emplace<Catch::JsonReporter::Writer>
            ((stack<Catch::JsonReporter::Writer,_std::deque<Catch::JsonReporter::Writer,_std::allocator<Catch::JsonReporter::Writer>_>_>
              *)in_RDI,(Writer *)in_stack_fffffffffffffdf8);
  pvVar1 = std::
           stack<Catch::JsonObjectWriter,_std::deque<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>_>
           ::top((stack<Catch::JsonObjectWriter,_std::deque<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>_>
                  *)0x1a3844);
  return pvVar1;
}

Assistant:

JsonObjectWriter& JsonReporter::startObject( StringRef key ) {
        m_objectWriters.emplace(
            m_objectWriters.top().write( key ).writeObject() );
        m_writers.emplace( Writer::Object );
        return m_objectWriters.top();
    }